

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deflate_params.cc
# Opt level: O0

void __thiscall deflate_params_Test::TestBody(deflate_params_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  time_t tVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  zng_deflate_param_value params [2];
  int strategy;
  int level;
  int err;
  time_t now;
  int32_t i;
  uint32_t diff;
  uint32_t uncompr_len;
  uint32_t compr_len;
  uint8_t *uncompr;
  uint8_t *compr;
  zng_stream d_stream;
  zng_stream c_stream;
  undefined4 in_stack_fffffffffffff9e8;
  int32_t in_stack_fffffffffffff9ec;
  zng_stream *in_stack_fffffffffffff9f0;
  uint *in_stack_fffffffffffff9f8;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  char *in_stack_fffffffffffffa08;
  zng_deflate_param_value *in_stack_fffffffffffffa10;
  AssertionResult *pAVar5;
  undefined4 in_stack_fffffffffffffa18;
  Type in_stack_fffffffffffffa1c;
  Type type;
  AssertHelper *in_stack_fffffffffffffa20;
  int32_t in_stack_fffffffffffffa34;
  zng_stream *in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa48;
  undefined1 in_stack_fffffffffffffa4f;
  zng_deflate_param_value *in_stack_fffffffffffffa50;
  zng_stream *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  AssertionResult *in_stack_fffffffffffffa68;
  AssertHelper *in_stack_fffffffffffffa70;
  AssertionResult *this_02;
  undefined4 in_stack_fffffffffffffab4;
  int32_t flush;
  zng_stream *in_stack_fffffffffffffab8;
  AssertionResult local_450 [2];
  undefined4 local_42c;
  AssertionResult local_428 [2];
  undefined4 local_404;
  AssertionResult local_400 [2];
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  undefined4 local_3b4;
  AssertionResult local_3b0 [2];
  undefined4 local_38c;
  AssertionResult local_388 [2];
  undefined4 local_364;
  AssertionResult local_360 [2];
  undefined4 local_33c;
  AssertionResult local_338 [2];
  undefined4 local_314;
  AssertionResult local_310 [2];
  undefined4 local_2ec;
  AssertionResult local_2e8 [2];
  undefined4 local_2c4;
  AssertionResult local_2c0 [2];
  undefined4 local_29c;
  AssertionResult local_298 [2];
  undefined4 local_274;
  AssertionResult local_270 [2];
  undefined4 local_24c;
  AssertionResult local_248 [2];
  undefined4 local_224;
  AssertionResult local_220;
  string local_210 [55];
  undefined1 local_1d9;
  AssertionResult local_1d8;
  uint local_1c4;
  string local_1c0 [71];
  undefined1 local_179;
  AssertionResult local_178;
  undefined4 local_168;
  undefined4 *local_160;
  undefined8 local_158;
  undefined4 local_148;
  undefined4 *local_140;
  undefined8 local_138;
  undefined4 local_11c;
  undefined4 local_118;
  int32_t local_114;
  time_t local_110;
  int local_108;
  int local_104;
  undefined4 local_100;
  undefined4 local_fc;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  void *pvStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  void *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  void *pvStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_118 = 0xffffffff;
  local_11c = 0xffffffff;
  local_168 = 0;
  local_160 = &local_118;
  local_158 = 4;
  local_148 = 1;
  local_140 = &local_11c;
  local_138 = 4;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  pvStack_60 = (void *)0x0;
  local_78 = (void *)0x0;
  uStack_70 = 0;
  local_18 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  pvStack_d0 = (void *)0x0;
  local_e8 = (void *)0x0;
  uStack_e0 = 0;
  local_88 = 0;
  local_f0 = calloc(1,0xc000);
  local_179 = local_f0 != (void *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff9f0,
             (bool *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),(type *)0x12d3a1)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffa68,
               (char *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
               (char *)in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,(char *)in_stack_fffffffffffffa10
               ,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string(local_1c0);
    testing::Message::~Message((Message *)0x12d48b);
  }
  local_1c4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d51c);
  if (local_1c4 == 0) {
    local_f8 = calloc(1,0x10000);
    local_1d9 = local_f8 != (void *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9f0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
               (type *)0x12d579);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffa68,
                 (char *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                 (char *)in_stack_fffffffffffffa58,(char *)in_stack_fffffffffffffa50);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                 (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
      std::__cxx11::string::~string(local_210);
      testing::Message::~Message((Message *)0x12d675);
    }
    local_1c4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d706);
    if (local_1c4 == 0) {
      local_fc = 0xc000;
      local_100 = 0x10000;
      tVar4 = time(&local_110);
      srand((uint)tVar4);
      for (local_108 = 0; local_108 < 0x2000; local_108 = local_108 + 1) {
        iVar3 = rand();
        *(char *)((long)local_f8 + (long)local_108) = (char)(iVar3 % 0x100);
      }
      local_114 = zng_deflateInit(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
      local_224 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12d853);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12d8b6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d90e);
      pvStack_60 = local_f0;
      local_58 = CONCAT44(local_58._4_4_,local_fc);
      local_78 = local_f8;
      uStack_70 = CONCAT44(uStack_70._4_4_,local_100);
      local_114 = zng_deflate(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34);
      local_24c = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12da0d);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12da70);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12dac5);
      local_274 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12db72);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12dbd5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12dc2d);
      zng_deflateGetParams
                ((zng_stream *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
      local_29c = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12dcf4);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12dd57);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ddac);
      local_2c4 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12de59);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12debc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12df14);
      local_118 = 0;
      local_11c = 0;
      zng_deflateSetParams
                (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                 CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48));
      local_78 = local_f0;
      local_104 = (int)pvStack_60 - (int)local_f0;
      uStack_70 = CONCAT44(uStack_70._4_4_,local_104);
      local_114 = zng_deflate(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34);
      local_2ec = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12e044);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e0a7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e0ff);
      local_118 = 0xffffffff;
      local_11c = 0xffffffff;
      zng_deflateGetParams
                ((zng_stream *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
      local_314 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_310);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        in_stack_fffffffffffffab8 =
             (zng_stream *)testing::AssertionResult::failure_message((AssertionResult *)0x12e1dc);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e23f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e294);
      local_33c = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
      flush = CONCAT13(bVar1,(int3)in_stack_fffffffffffffab4);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12e341);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e3a4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e3fc);
      local_118 = 9;
      local_11c = 1;
      zng_deflateSetParams
                (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                 CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48));
      local_78 = local_f8;
      uStack_70 = CONCAT44(uStack_70._4_4_,local_100);
      local_114 = zng_deflate(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34);
      local_364 = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_360);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12e515);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffa70,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e578);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e5d0);
      local_114 = zng_deflate(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34);
      local_38c = 1;
      this_02 = local_388;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        in_stack_fffffffffffffa68 =
             (AssertionResult *)
             testing::AssertionResult::failure_message((AssertionResult *)0x12e696);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e6f9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e74e);
      local_114 = zng_deflateEnd((zng_stream *)
                                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      local_3b4 = 0;
      pAVar5 = local_3b0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12e803);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e860);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e8b8);
      local_e8 = local_f0;
      uStack_e0 = CONCAT44(uStack_e0._4_4_,local_fc);
      local_114 = zng_inflateInit((zng_stream *)0x12e8e3);
      local_3dc = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        testing::AssertionResult::failure_message((AssertionResult *)0x12e98b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                   (char *)in_stack_fffffffffffffa10,(int)((ulong)in_stack_fffffffffffffa08 >> 0x20)
                   ,(char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12e9e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ea3d);
      do {
        pvStack_d0 = local_f8;
        local_c8 = CONCAT44(local_c8._4_4_,local_100);
        local_114 = zng_inflate(in_stack_fffffffffffffab8,flush);
        if (local_114 == 1) break;
        local_404 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffa08,
                   (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                   (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_400);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffa20);
          in_stack_fffffffffffffa20 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x12eb21);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                     (char *)in_stack_fffffffffffffa10,
                     (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffffa68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
          testing::Message::~Message((Message *)0x12eb7e);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ebd6);
      } while (local_114 == 0);
      local_114 = zng_inflateEnd((zng_stream *)
                                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      local_42c = 0;
      pAVar5 = local_428;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (int *)in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa1c);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        in_stack_fffffffffffffa08 =
             testing::AssertionResult::failure_message((AssertionResult *)0x12ec99);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,type,&pAVar5->success_,
                   (int)((ulong)in_stack_fffffffffffffa08 >> 0x20),
                   (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9f0);
        testing::Message::~Message((Message *)0x12ecf6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ed4b);
      this_01 = local_450;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffa08,
                 (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                 (unsigned_long *)this_01,(uint *)in_stack_fffffffffffff9f0);
      iVar3 = (int)((ulong)in_stack_fffffffffffffa08 >> 0x20);
      uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
      if (!(bool)uVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffa20);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x12edfd);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffa20,type,&pAVar5->success_,iVar3,
                   (char *)CONCAT17(uVar2,in_stack_fffffffffffffa00));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_02,(Message *)in_stack_fffffffffffffa68);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x12ee5a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x12eeaf);
      free(local_f0);
      free(local_f8);
    }
  }
  return;
}

Assistant:

TEST(deflate, params) {
    PREFIX3(stream) c_stream, d_stream;
    uint8_t *compr, *uncompr;
    uint32_t compr_len, uncompr_len;
    uint32_t diff;
    int32_t i;
    time_t now;
    int err;
#ifndef ZLIB_COMPAT
    int level = -1;
    int strategy = -1;
    zng_deflate_param_value params[2];

    params[0].param = Z_DEFLATE_LEVEL;
    params[0].buf = &level;
    params[0].size = sizeof(level);

    params[1].param = Z_DEFLATE_STRATEGY;
    params[1].buf = &strategy;
    params[1].size = sizeof(strategy);
#endif

    memset(&c_stream, 0, sizeof(c_stream));
    memset(&d_stream, 0, sizeof(d_stream));

    compr = (uint8_t *)calloc(1, COMPR_BUFFER_SIZE);
    ASSERT_TRUE(compr != NULL);
    uncompr = (uint8_t *)calloc(1, UNCOMPR_BUFFER_SIZE);
    ASSERT_TRUE(uncompr != NULL);

    compr_len = COMPR_BUFFER_SIZE;
    uncompr_len = UNCOMPR_BUFFER_SIZE;

    srand((unsigned)time(&now));
    for (i = 0; i < UNCOMPR_RAND_SIZE; i++)
        uncompr[i] = (uint8_t)(rand() % 256);

    err = PREFIX(deflateInit)(&c_stream, Z_BEST_SPEED);
    EXPECT_EQ(err, Z_OK);

    c_stream.next_out = compr;
    c_stream.avail_out = compr_len;
    c_stream.next_in = uncompr;
    c_stream.avail_in = uncompr_len;

    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    EXPECT_EQ(err, Z_OK);
    EXPECT_EQ(c_stream.avail_in, 0);

    /* Feed in already compressed data and switch to no compression: */
#ifndef ZLIB_COMPAT
    zng_deflateGetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
    EXPECT_EQ(level, Z_BEST_SPEED);
    EXPECT_EQ(strategy, Z_DEFAULT_STRATEGY);

    level = Z_NO_COMPRESSION;
    strategy = Z_DEFAULT_STRATEGY;
    zng_deflateSetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
#else
    PREFIX(deflateParams)(&c_stream, Z_NO_COMPRESSION, Z_DEFAULT_STRATEGY);
#endif

    c_stream.next_in = compr;
    diff = (unsigned int)(c_stream.next_out - compr);
    c_stream.avail_in = diff;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    EXPECT_EQ(err, Z_OK);

    /* Switch back to compressing mode: */
#ifndef ZLIB_COMPAT
    level = -1;
    strategy = -1;
    zng_deflateGetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
    EXPECT_EQ(level, Z_NO_COMPRESSION);
    EXPECT_EQ(strategy, Z_DEFAULT_STRATEGY);

    level = Z_BEST_COMPRESSION;
    strategy = Z_FILTERED;
    zng_deflateSetParams(&c_stream, params, sizeof(params) / sizeof(params[0]));
#else
    PREFIX(deflateParams)(&c_stream, Z_BEST_COMPRESSION, Z_FILTERED);
#endif

    c_stream.next_in = uncompr;
    c_stream.avail_in = (unsigned int)uncompr_len;
    err = PREFIX(deflate)(&c_stream, Z_NO_FLUSH);
    EXPECT_EQ(err, Z_OK);

    err = PREFIX(deflate)(&c_stream, Z_FINISH);
    EXPECT_EQ(err, Z_STREAM_END);

    err = PREFIX(deflateEnd)(&c_stream);
    EXPECT_EQ(err, Z_OK);

    d_stream.next_in  = compr;
    d_stream.avail_in = (unsigned int)compr_len;

    err = PREFIX(inflateInit)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    do {
        d_stream.next_out = uncompr;            /* discard the output */
        d_stream.avail_out = uncompr_len;
        err = PREFIX(inflate)(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END)
            break;
        EXPECT_EQ(err, Z_OK);
    } while (err == Z_OK);

    err = PREFIX(inflateEnd)(&d_stream);
    EXPECT_EQ(err, Z_OK);

    EXPECT_EQ(d_stream.total_out, (2 * uncompr_len) + diff);

    free(compr);
    free(uncompr);
}